

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

int __thiscall QCss::Parser::init(Parser *this,EVP_PKEY_CTX *ctx)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char cVar4;
  QDebug *this_00;
  char in_DL;
  long in_FS_OFFSET;
  QFileInfo local_d0 [8];
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_a8;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QArrayDataPointer<char16_t> local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = *(Data **)ctx;
  local_78.ptr = *(char16_t **)(ctx + 8);
  local_78.size = *(qsizetype *)(ctx + 0x10);
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (in_DL == '\0') {
    QString::clear(&this->sourcePath);
  }
  else {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_88,(QString *)ctx);
    cVar4 = QFile::open((QFile *)&local_88,1);
    if (cVar4 == '\0') {
      local_58._0_4_ = 2;
      local_58._20_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      local_58._24_8_ = "default";
      QMessageLogger::warning();
      this_00 = QDebug::operator<<((QDebug *)&local_a8,"QCss::Parser - Failed to load file ");
      QDebug::operator<<(this_00,(QString *)ctx);
      QDebug::~QDebug((QDebug *)&local_a8);
      QString::clear((QString *)&local_78);
    }
    else {
      QFileInfo::QFileInfo(local_d0,(QString *)&local_78);
      QFileInfo::absolutePath();
      qVar1 = local_c8.size;
      pcVar3 = local_c8.ptr;
      pDVar2 = local_c8.d;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = (char16_t *)0x0;
      local_c8.size = 0;
      local_58._0_4_ = SUB84(pDVar2,0);
      local_58._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
      local_58._8_4_ = SUB84(pcVar3,0);
      local_58._12_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
      local_58._16_4_ = (undefined4)qVar1;
      local_58._20_4_ = (undefined4)((ulong)qVar1 >> 0x20);
      local_58._24_2_ = 0x2f;
      QStringBuilder<QString,_char16_t>::convertTo<QString>
                ((QString *)&local_a8,(QStringBuilder<QString,_char16_t> *)local_58);
      pDVar2 = (this->sourcePath).d.d;
      pcVar3 = (this->sourcePath).d.ptr;
      (this->sourcePath).d.d = local_a8.d;
      (this->sourcePath).d.ptr = local_a8.ptr;
      qVar1 = (this->sourcePath).d.size;
      (this->sourcePath).d.size = local_a8.size;
      local_a8.d = pDVar2;
      local_a8.ptr = pcVar3;
      local_a8.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QFileInfo::~QFileInfo(local_d0);
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextStream::QTextStream((QTextStream *)&local_a8,(QIODevice *)&local_88);
      QTextStream::readAll();
      pDVar2 = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
      pcVar3 = (char16_t *)CONCAT44(local_58._12_4_,local_58._8_4_);
      local_58._0_4_ = SUB84(local_78.d,0);
      local_58._4_4_ = (undefined4)((ulong)local_78.d >> 0x20);
      local_58._8_4_ = SUB84(local_78.ptr,0);
      local_58._12_4_ = (undefined4)((ulong)local_78.ptr >> 0x20);
      qVar1 = CONCAT44(local_58._20_4_,local_58._16_4_);
      local_58._16_4_ = (undefined4)local_78.size;
      local_58._20_4_ = (undefined4)((ulong)local_78.size >> 0x20);
      local_78.d = pDVar2;
      local_78.ptr = pcVar3;
      local_78.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
      QTextStream::~QTextStream((QTextStream *)&local_a8);
    }
    QFile::~QFile((QFile *)&local_88);
  }
  this->hasEscapeSequences = false;
  QList<QCss::Symbol>::clear(&this->symbols);
  QList<QCss::Symbol>::reserve(&this->symbols,8);
  Scanner::preprocess((QString *)local_58,(QString *)&local_78,&this->hasEscapeSequences);
  Scanner::scan((QString *)local_58,&this->symbols);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  this->index = 0;
  this->errorIndex = -1;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void Parser::init(const QString &css, bool isFile)
{
    QString styleSheet = css;
    if (isFile) {
        QFile file(css);
        if (file.open(QFile::ReadOnly)) {
            sourcePath = QFileInfo(styleSheet).absolutePath() + u'/';
            QTextStream stream(&file);
            styleSheet = stream.readAll();
        } else {
            qWarning() << "QCss::Parser - Failed to load file " << css;
            styleSheet.clear();
        }
    } else {
        sourcePath.clear();
    }

    hasEscapeSequences = false;
    symbols.clear();
    symbols.reserve(8);
    Scanner::scan(Scanner::preprocess(styleSheet, &hasEscapeSequences), &symbols);
    index = 0;
    errorIndex = -1;
}